

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfCRgbaFile.cpp
# Opt level: O0

ImfTiledOutputFile *
ImfOpenTiledOutputFile
          (char *name,ImfHeader *hdr,int channels,int xSize,int ySize,int mode,int rmode)

{
  ImfTiledOutputFile *pIVar1;
  char *unaff_RBX;
  ImfHeader *in_RSI;
  undefined8 in_RDI;
  TiledRgbaOutputFile *unaff_retaddr;
  LevelMode in_stack_00000010;
  LevelRoundingMode in_stack_00000018;
  int in_stack_00000020;
  exception *e;
  int tileYSize;
  Header *in_stack_fffffffffffffff0;
  
  pIVar1 = (ImfTiledOutputFile *)operator_new(0x18);
  anon_unknown.dwarf_70604::header(in_RSI);
  tileYSize = (int)((ulong)in_RSI >> 0x20);
  Imf_3_4::globalThreadCount();
  Imf_3_4::TiledRgbaOutputFile::TiledRgbaOutputFile
            (unaff_retaddr,unaff_RBX,in_stack_fffffffffffffff0,(RgbaChannels)((ulong)in_RDI >> 0x20)
             ,(int)in_RDI,tileYSize,in_stack_00000010,in_stack_00000018,in_stack_00000020);
  return pIVar1;
}

Assistant:

ImfTiledOutputFile*
ImfOpenTiledOutputFile (
    const char       name[],
    const ImfHeader* hdr,
    int              channels,
    int              xSize,
    int              ySize,
    int              mode,
    int              rmode)
{
    try
    {
        return (ImfTiledOutputFile*) new OPENEXR_IMF_INTERNAL_NAMESPACE::
            TiledRgbaOutputFile (
                name,
                *header (hdr),
                OPENEXR_IMF_INTERNAL_NAMESPACE::RgbaChannels (channels),
                xSize,
                ySize,
                OPENEXR_IMF_INTERNAL_NAMESPACE::LevelMode (mode),
                OPENEXR_IMF_INTERNAL_NAMESPACE::LevelRoundingMode (rmode));
    }
    catch (const std::exception& e)
    {
        setErrorMessage (e);
        return 0;
    }
}